

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O2

int Fxu_Select(Fxu_Matrix *p,Fxu_Single **ppSingle,Fxu_Double **ppDouble)

{
  uint uVar1;
  Fxu_Pair *pFVar2;
  uint uVar3;
  int iVar4;
  Fxu_Single *pFVar5;
  Fxu_Double *pFVar6;
  uint uVar7;
  Fxu_ListSingle *pFVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  Fxu_Matrix *p_00;
  long lVar12;
  int local_328;
  int nVarsC1;
  Fxu_Double **local_320;
  int piVarsC2 [10];
  int iVar1C;
  Fxu_Double *pDoubles [20];
  Fxu_Single *pSingles [20];
  Fxu_Single *pDComplS [20];
  Fxu_Double *pSCompl [20];
  
  local_320 = ppDouble;
  memset(pSingles,0,0xa0);
  memset(pDoubles,0,0xa0);
  memset(pSCompl,0,0xa0);
  p_00 = (Fxu_Matrix *)pDComplS;
  memset(p_00,0,0xa0);
  for (lVar12 = 0; lVar12 != 0x14; lVar12 = lVar12 + 1) {
    p_00 = (Fxu_Matrix *)p->pHeapSingle;
    pFVar5 = Fxu_HeapSingleGetMax((Fxu_HeapSingle *)p_00);
    pSingles[lVar12] = pFVar5;
    if (pFVar5 == (Fxu_Single *)0x0) break;
  }
  for (lVar10 = 0; lVar12 != lVar10; lVar10 = lVar10 + 1) {
    if (pSingles[lVar10] != (Fxu_Single *)0x0) {
      p_00 = (Fxu_Matrix *)p->pHeapSingle;
      Fxu_HeapSingleInsert((Fxu_HeapSingle *)p_00,pSingles[lVar10]);
    }
  }
  for (lVar10 = 0; lVar10 != 0x14; lVar10 = lVar10 + 1) {
    p_00 = (Fxu_Matrix *)p->pHeapDouble;
    pFVar6 = Fxu_HeapDoubleGetMax((Fxu_HeapDouble *)p_00);
    pDoubles[lVar10] = pFVar6;
    if (pFVar6 == (Fxu_Double *)0x0) break;
  }
  for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
    if (pDoubles[lVar11] != (Fxu_Double *)0x0) {
      p_00 = (Fxu_Matrix *)p->pHeapDouble;
      Fxu_HeapDoubleInsert((Fxu_HeapDouble *)p_00,pDoubles[lVar11]);
    }
  }
  for (lVar11 = 0; lVar12 != lVar11; lVar11 = lVar11 + 1) {
    pFVar5 = pSingles[lVar11];
    if (pFVar5 != (Fxu_Single *)0x0) {
      uVar1 = pFVar5->pVar1->iVar;
      uVar3 = pFVar5->pVar2->iVar;
      iVar1C = uVar1 ^ 1;
      piVarsC2[0] = uVar3 ^ 1;
      if (uVar3 == 0xfffffffe || uVar1 == 0xfffffffe) {
        pFVar6 = (Fxu_Double *)0x0;
      }
      else {
        if (piVarsC2[0] <= iVar1C) {
          __assert_fail("iVar1C < iVar2C",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                        ,0xea,
                        "Fxu_Double *Fxu_MatrixFindComplementSingle(Fxu_Matrix *, Fxu_Single *)");
        }
        p_00 = p;
        pFVar6 = Fxu_MatrixFindDouble(p,&iVar1C,piVarsC2,1,1);
      }
      pSCompl[lVar11] = pFVar6;
    }
  }
  lVar11 = 0;
  do {
    if (lVar10 == lVar11) {
      iVar4 = -1;
      for (lVar11 = 0; lVar12 != lVar11; lVar11 = lVar11 + 1) {
        iVar9 = pSingles[lVar11]->Weight;
        pFVar6 = pSCompl[lVar11];
        if (pFVar6 != (Fxu_Double *)0x0) {
          pFVar2 = (pFVar6->lPairs).pHead;
          iVar9 = iVar9 + pFVar6->Weight + pFVar2->nLits1 + pFVar2->nLits2;
        }
        if (iVar4 < iVar9) {
          *ppSingle = pSingles[lVar11];
          *local_320 = pFVar6;
          iVar4 = iVar9;
        }
      }
      for (lVar12 = 0; lVar10 != lVar12; lVar12 = lVar12 + 1) {
        pFVar6 = pDoubles[lVar12];
        iVar9 = pFVar6->Weight;
        pFVar5 = pDComplS[lVar12];
        if (pFVar5 != (Fxu_Single *)0x0) {
          pFVar2 = (pFVar6->lPairs).pHead;
          iVar9 = iVar9 + pFVar5->Weight + pFVar2->nLits1 + pFVar2->nLits2;
        }
        if (iVar4 < iVar9) {
          *ppSingle = pFVar5;
          *local_320 = pFVar6;
          iVar4 = iVar9;
        }
      }
      return iVar4;
    }
    pFVar6 = pDoubles[lVar11];
    if (pFVar6 != (Fxu_Double *)0x0) {
      pFVar2 = (pFVar6->lPairs).pHead;
      if ((pFVar2->nLits1 == 1) && (pFVar2->nLits2 == 1)) {
        Fxu_MatrixGetDoubleVars(p_00,pFVar6,&iVar1C,piVarsC2,&nVarsC1,&local_328);
        if (nVarsC1 != 1) {
          __assert_fail("nVarsC1 == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                        ,0x104,
                        "Fxu_Single *Fxu_MatrixFindComplementDouble2(Fxu_Matrix *, Fxu_Double *)");
        }
        if (local_328 != 1) {
          __assert_fail("nVarsC2 == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                        ,0x105,
                        "Fxu_Single *Fxu_MatrixFindComplementDouble2(Fxu_Matrix *, Fxu_Double *)");
        }
        if (piVarsC2[0] <= iVar1C) {
          __assert_fail("iVar1 < iVar2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSelect.c"
                        ,0x108,
                        "Fxu_Single *Fxu_MatrixFindComplementDouble2(Fxu_Matrix *, Fxu_Double *)");
        }
        if (piVarsC2[0] != -2 && iVar1C != -2) {
          uVar7 = piVarsC2[0] ^ 1;
          uVar3 = iVar1C ^ 1;
          uVar1 = uVar7;
          if ((int)uVar3 < (int)uVar7) {
            uVar1 = uVar3;
          }
          pFVar8 = &p->lSingles;
          if ((int)uVar3 <= (int)uVar7) {
            uVar3 = uVar7;
          }
          while (pFVar5 = pFVar8->pHead, pFVar5 != (Fxu_Single *)0x0) {
            if ((pFVar5->pVar1->iVar == uVar1) && (pFVar5->pVar2->iVar == uVar3)) goto LAB_003aba09;
            pFVar8 = (Fxu_ListSingle *)&pFVar5->pNext;
          }
        }
      }
      pFVar5 = (Fxu_Single *)0x0;
LAB_003aba09:
      pDComplS[lVar11] = pFVar5;
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

int Fxu_Select( Fxu_Matrix * p, Fxu_Single ** ppSingle, Fxu_Double ** ppDouble )
{
    // the top entries
    Fxu_Single * pSingles[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Double * pDoubles[MAX_SIZE_LOOKAHEAD] = {0};
    // the complements
    Fxu_Double * pSCompl[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Single * pDComplS[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Double * pDComplD[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Pair * pPair;
    int nSingles;
    int nDoubles;
    int i;
    int WeightBest;
    int WeightCur;
    int iNum, fBestS;

    // collect the top entries from the queues
    for ( nSingles = 0; nSingles < MAX_SIZE_LOOKAHEAD; nSingles++ )
    {
        pSingles[nSingles] = Fxu_HeapSingleGetMax( p->pHeapSingle );
        if ( pSingles[nSingles] == NULL )
            break;
    }
    // put them back into the queue
    for ( i = 0; i < nSingles; i++ )
        if ( pSingles[i] )
            Fxu_HeapSingleInsert( p->pHeapSingle, pSingles[i] );
        
    // the same for doubles
    // collect the top entries from the queues
    for ( nDoubles = 0; nDoubles < MAX_SIZE_LOOKAHEAD; nDoubles++ )
    {
        pDoubles[nDoubles] = Fxu_HeapDoubleGetMax( p->pHeapDouble );
        if ( pDoubles[nDoubles] == NULL )
            break;
    }
    // put them back into the queue
    for ( i = 0; i < nDoubles; i++ )
        if ( pDoubles[i] )
            Fxu_HeapDoubleInsert( p->pHeapDouble, pDoubles[i] );

    // for each single, find the complement double (if any)
    for ( i = 0; i < nSingles; i++ )
        if ( pSingles[i] )
            pSCompl[i] = Fxu_MatrixFindComplementSingle( p, pSingles[i] );

    // for each double, find the complement single or double (if any)
    for ( i = 0; i < nDoubles; i++ )
        if ( pDoubles[i] )
        {
            pPair = pDoubles[i]->lPairs.pHead;
            if ( pPair->nLits1 == 1 && pPair->nLits2 == 1 )
            {
                pDComplS[i] = Fxu_MatrixFindComplementDouble2( p, pDoubles[i] );
                pDComplD[i] = NULL;
            }
//            else if ( pPair->nLits1 == 2 && pPair->nLits2 == 2 )
//            {
//                pDComplS[i] = NULL;
//                pDComplD[i] = Fxu_MatrixFindComplementDouble4( p, pDoubles[i] );
//            }
            else
            {
                pDComplS[i] = NULL;
                pDComplD[i] = NULL;
            }
        }

    // select the best pair
    WeightBest = -1;
    for ( i = 0; i < nSingles; i++ )
    {
        WeightCur = pSingles[i]->Weight;
        if ( pSCompl[i] )
        {
            // add the weight of the double
            WeightCur += pSCompl[i]->Weight;
            // there is no need to implement this double, so...
            pPair      = pSCompl[i]->lPairs.pHead;
            WeightCur += pPair->nLits1 + pPair->nLits2;
        }
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            *ppSingle = pSingles[i];
            *ppDouble = pSCompl[i];
            fBestS = 1;
            iNum = i;
        }
    }
    for ( i = 0; i < nDoubles; i++ )
    {
        WeightCur = pDoubles[i]->Weight;
        if ( pDComplS[i] )
        {
            // add the weight of the single
            WeightCur += pDComplS[i]->Weight;
            // there is no need to implement this double, so...
            pPair      = pDoubles[i]->lPairs.pHead;
            WeightCur += pPair->nLits1 + pPair->nLits2;
        }
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            *ppSingle = pDComplS[i];
            *ppDouble = pDoubles[i];
            fBestS = 0;
            iNum = i;
        }
    }
/*
    // print the statistics
    printf( "\n" );
    for ( i = 0; i < nSingles; i++ )
    {
        printf( "Single #%d: Weight = %3d. ", i, pSingles[i]->Weight );
        printf( "Compl: " );
        if ( pSCompl[i] == NULL )
            printf( "None." );
        else
            printf( "D  Weight = %3d  Sum = %3d", 
                pSCompl[i]->Weight, pSCompl[i]->Weight + pSingles[i]->Weight );
        printf( "\n" );
    }
    printf( "\n" );
    for ( i = 0; i < nDoubles; i++ )
    {
        printf( "Double #%d: Weight = %3d. ", i, pDoubles[i]->Weight );
        printf( "Compl: " );
        if ( pDComplS[i] == NULL && pDComplD[i] == NULL )
            printf( "None." );
        else if ( pDComplS[i] )
            printf( "S  Weight = %3d  Sum = %3d", 
                pDComplS[i]->Weight, pDComplS[i]->Weight + pDoubles[i]->Weight );
        else if ( pDComplD[i] )
            printf( "D  Weight = %3d  Sum = %3d", 
                pDComplD[i]->Weight, pDComplD[i]->Weight + pDoubles[i]->Weight );
        printf( "\n" );
    }
    if ( WeightBest == -1 )
        printf( "Selected NONE\n" );
    else
    {
        printf( "Selected = %s.  ", fBestS? "S": "D" );
        printf( "Number = %d.  ", iNum );
        printf( "Weight = %d.\n", WeightBest );
    }
    printf( "\n" );
*/
    return WeightBest;
}